

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

container_t * container_clone(container_t *c,uint8_t typecode)

{
  container_t *pcVar1;
  undefined7 in_register_00000031;
  
  pcVar1 = (container_t *)
           (*(code *)(&DAT_001333c8 +
                     *(int *)(&DAT_001333c8 +
                             (ulong)((int)CONCAT71(in_register_00000031,typecode) - 1) * 4)))();
  return pcVar1;
}

Assistant:

container_t *container_clone(const container_t *c, uint8_t typecode) {
    // We do not want to allow cloning of shared containers.
    // c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_clone(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_clone(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_clone(const_CAST_run(c));
        case SHARED_CONTAINER_TYPE:
            // Shared containers are not cloneable. Are you mixing COW and
            // non-COW bitmaps?
            return NULL;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}